

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::initializeMapBuilder
          (CommonCore *this,string_view request,uint16_t index,QueryReuse reuse,bool force_ordering)

{
  json_value jVar1;
  pointer ppVar2;
  BaseTimeCoordinator *pBVar3;
  undefined1 auVar4 [16];
  string_view queryStr;
  string_view queryStr_00;
  string_view queryStr_01;
  size_type sVar5;
  FedInfo *pFVar6;
  bool bVar7;
  FederateStates FVar8;
  int iVar9;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this_00;
  reference pvVar10;
  int extraout_var;
  string *psVar11;
  value_t vVar12;
  undefined6 in_register_0000000a;
  pointer ptVar13;
  pointer __str;
  uint uVar14;
  action_t startingAction;
  string *this_01;
  GlobalFederateId *dep;
  _Alloc_hider _Var15;
  ulong uVar16;
  _Head_base<0UL,_helics::fileops::JsonMapBuilder,_false> *this_02;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  string_view queryStr_02;
  string ret;
  string_view request_local;
  data local_1e8;
  const_iterator __begin2;
  string local_1c0;
  data local_1a0;
  data local_190;
  data local_180;
  string local_170;
  data local_150;
  string local_140;
  const_iterator __end2;
  key_type local_108;
  ActionMessage queryReq;
  
  request_local._M_str = request._M_str;
  request_local._M_len = request._M_len;
  uVar14 = (uint)CONCAT62(in_register_0000000a,index);
  ptVar13 = (this->mapBuilders).
            super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = CONCAT62(in_register_0000000a,index) & 0xffffffff;
  if (((uint)(((long)(this->mapBuilders).
                     super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar13) / 0x60) & 0xffff)
      <= uVar14) {
    std::
    vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
    ::resize(&this->mapBuilders,uVar16 + 1);
    ptVar13 = (this->mapBuilders).
              super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  this_02 = &ptVar13[uVar16].
             super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
             .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>;
  ptVar13[uVar16].
  super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
  .
  super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
  .super__Tuple_impl<2UL,_helics::QueryReuse> = (_Tuple_impl<2UL,_helics::QueryReuse>)reuse;
  fileops::JsonMapBuilder::reset(&this_02->_M_head_impl);
  this_00 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             *)fileops::JsonMapBuilder::getJValue_abi_cxx11_(&this_02->_M_head_impl);
  BrokerBase::addBaseInformation(&this->super_BrokerBase,(json *)this_00,true);
  startingAction = cmd_query;
  if (force_ordering) {
    startingAction = cmd_query_ordered;
  }
  ActionMessage::ActionMessage(&queryReq,startingAction);
  if (index == 8) {
    ActionMessage::setAction(&queryReq,cmd_query_ordered);
  }
  SmallBuffer::operator=(&queryReq.payload,&request_local);
  queryReq.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  queryReq.counter = index;
  if ((((this->loopFederates).dataStorage.csize != 0) || (this->filterFed != (FilterFederate *)0x0))
     || (this->translatorFed != (TranslatorFederate *)0x0)) {
    init._M_len = 0;
    init._M_array = (iterator)&local_140.field_2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::array(init);
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"federates");
    vVar12 = (pvVar10->m_data).m_type;
    (pvVar10->m_data).m_type = local_140.field_2._M_local_buf[0];
    jVar1 = (pvVar10->m_data).m_value;
    (pvVar10->m_data).m_value = (json_value)local_140.field_2._8_8_;
    local_140.field_2._M_local_buf[0] = vVar12;
    local_140.field_2._8_8_ = jVar1;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_140.field_2);
    gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
    begin(&__begin2,&(this->loopFederates).dataStorage);
    gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
              (&__end2,&(this->loopFederates).dataStorage);
    while ((pFVar6 = __begin2.ptr, __begin2.offset != __end2.offset ||
           ((FedInfo **)CONCAT44(__begin2.vec._4_4_,__begin2.vec._0_4_) != __end2.vec))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ret,"federates",(allocator<char> *)&local_1c0);
      iVar9 = fileops::JsonMapBuilder::generatePlaceHolder
                        (&this_02->_M_head_impl,&ret,(pFVar6->fed->global_id)._M_i.gid);
      std::__cxx11::string::~string((string *)&ret);
      queryStr._M_str = request_local._M_str;
      queryStr._M_len = request_local._M_len;
      federateQuery_abi_cxx11_(&ret,this,pFVar6->fed,queryStr,force_ordering);
      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ret,"#wait");
      if (bVar7) {
        FVar8 = FederateState::getState(pFVar6->fed);
        if (FVar8 < TERMINATING) {
          queryReq.dest_id.gid = (pFVar6->fed->global_id)._M_i.gid;
          queryReq.messageID = iVar9;
          FederateState::addAction(pFVar6->fed,&queryReq);
        }
        else {
          queryStr_02._M_str = "global_state";
          queryStr_02._M_len = 0xc;
          federateQuery_abi_cxx11_(&local_1c0,this,pFVar6->fed,queryStr_02,force_ordering);
          fileops::JsonMapBuilder::addComponent(&this_02->_M_head_impl,&local_1c0,iVar9);
          std::__cxx11::string::~string((string *)&local_1c0);
        }
      }
      else {
        fileops::JsonMapBuilder::addComponent(&this_02->_M_head_impl,&ret,iVar9);
      }
      std::__cxx11::string::~string((string *)&ret);
      gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
      operator++(&__begin2);
    }
    if (this->filterFed != (FilterFederate *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ret,"federates",(allocator<char> *)&local_1c0);
      iVar9 = fileops::JsonMapBuilder::generatePlaceHolder
                        (&this_02->_M_head_impl,&ret,(this->filterFedID)._M_i.gid);
      std::__cxx11::string::~string((string *)&ret);
      queryStr_00._M_str = request_local._M_str;
      queryStr_00._M_len = request_local._M_len;
      FilterFederate::query_abi_cxx11_(&ret,this->filterFed,queryStr_00);
      fileops::JsonMapBuilder::addComponent(&this_02->_M_head_impl,&ret,iVar9);
      std::__cxx11::string::~string((string *)&ret);
    }
    if (this->translatorFed != (TranslatorFederate *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ret,"federates",(allocator<char> *)&local_1c0);
      iVar9 = fileops::JsonMapBuilder::generatePlaceHolder
                        (&this_02->_M_head_impl,&ret,(this->translatorFedID)._M_i.gid);
      std::__cxx11::string::~string((string *)&ret);
      queryStr_01._M_str = request_local._M_str;
      queryStr_01._M_len = request_local._M_len;
      TranslatorFederate::query_abi_cxx11_(&ret,this->translatorFed,queryStr_01);
      fileops::JsonMapBuilder::addComponent(&this_02->_M_head_impl,&ret,iVar9);
      std::__cxx11::string::~string((string *)&ret);
    }
  }
  switch(uVar14 & 0xffff) {
  case 2:
  case 9:
    if ((this->super_BrokerBase).hasTimeDependency != true) break;
    iVar9 = (*((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
              _vptr_BaseTimeCoordinator[0xd])();
    auVar4._4_4_ = extraout_var;
    auVar4._0_4_ = iVar9;
    auVar4._8_8_ = (long)extraout_var >> 0x1f;
    ret._M_dataplus._M_p =
         (pointer)((double)SUB168(auVar4 % SEXT816(1000000000),0) * 1e-09 +
                  (double)SUB168(auVar4 / SEXT816(1000000000),0));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<double,_double,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_140,(double *)&ret);
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"next_time");
    vVar12 = (pvVar10->m_data).m_type;
    this_01 = &local_140;
    goto LAB_0024e3fc;
  case 3:
    if ((this->super_BrokerBase).hasTimeDependency == true) {
      init_00._M_len = 0;
      init_00._M_array = (iterator)&local_150;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init_00);
      pvVar10 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"dependents");
      vVar12 = (pvVar10->m_data).m_type;
      (pvVar10->m_data).m_type = local_150.m_type;
      jVar1 = (pvVar10->m_data).m_value;
      (pvVar10->m_data).m_value = local_150.m_value;
      local_150.m_type = vVar12;
      local_150.m_value = jVar1;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_150);
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)&ret
                 ,(this->super_BrokerBase).timeCoord._M_t.
                  super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                  .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      sVar5 = ret._M_string_length;
      for (_Var15 = ret._M_dataplus; _Var15._M_p != (pointer)sVar5; _Var15._M_p = _Var15._M_p + 4) {
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(this_00,"dependents");
        __begin2.vec._0_4_ = *(undefined4 *)_Var15._M_p;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1c0,(int *)&__begin2);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar10,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)&local_1c0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_1c0);
      }
      std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
      ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                     *)&ret);
      init_02._M_len = 0;
      init_02._M_array = (iterator)&local_170.field_2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init_02);
      pvVar10 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"dependencies");
      vVar12 = (pvVar10->m_data).m_type;
      (pvVar10->m_data).m_type = local_170.field_2._M_local_buf[0];
      jVar1 = (pvVar10->m_data).m_value;
      (pvVar10->m_data).m_value = (json_value)local_170.field_2._8_8_;
      local_170.field_2._M_local_buf[0] = vVar12;
      local_170.field_2._8_8_ = jVar1;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_170.field_2);
      BaseTimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)&ret
                 ,(this->super_BrokerBase).timeCoord._M_t.
                  super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                  .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      for (_Var15 = ret._M_dataplus; _Var15._M_p != (pointer)ret._M_string_length;
          _Var15._M_p = _Var15._M_p + 4) {
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(this_00,"dependencies");
        __begin2.vec._0_4_ = *(undefined4 *)_Var15._M_p;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1c0,(int *)&__begin2);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar10,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)&local_1c0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_1c0);
      }
      std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
      ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                     *)&ret);
    }
    break;
  case 6:
    psVar11 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_170,psVar11);
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"state");
    vVar12 = (pvVar10->m_data).m_type;
    this_01 = &local_170;
LAB_0024e3fc:
    (pvVar10->m_data).m_type = *(value_t *)&(this_01->_M_dataplus)._M_p;
    *(value_t *)&(this_01->_M_dataplus)._M_p = vVar12;
    jVar1 = (pvVar10->m_data).m_value;
    (pvVar10->m_data).m_value = (json_value)this_01->_M_string_length;
    this_01->_M_string_length = (size_type)jVar1;
LAB_0024e54b:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)this_01);
    break;
  case 7:
    psVar11 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_180,psVar11);
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"state");
    vVar12 = (pvVar10->m_data).m_type;
    (pvVar10->m_data).m_type = local_180.m_type;
    jVar1 = (pvVar10->m_data).m_value;
    (pvVar10->m_data).m_value = local_180.m_value;
    local_180.m_type = vVar12;
    local_180.m_value = jVar1;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_180);
    pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    if ((pBVar3 != (BaseTimeCoordinator *)0x0) &&
       (*(pointer *)
         &(pBVar3->dependencies).dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> !=
        (pBVar3->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_190,(nullptr_t)0x0);
      pvVar10 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"time");
      vVar12 = (pvVar10->m_data).m_type;
      (pvVar10->m_data).m_type = local_190.m_type;
      jVar1 = (pvVar10->m_data).m_value;
      (pvVar10->m_data).m_value = local_190.m_value;
      local_190.m_type = vVar12;
      local_190.m_value = jVar1;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_190);
      pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      pvVar10 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"time");
      (*pBVar3->_vptr_BaseTimeCoordinator[0xc])(pBVar3,pvVar10);
    }
    break;
  case 0xe:
    if ((this->tags).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->tags).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    init_01._M_len = 0;
    init_01._M_array = (iterator)&ret;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::object(init_01);
    ppVar2 = (this->tags).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__str = (this->tags).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __str != ppVar2; __str = __str + 1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1e8,&__str->second);
      std::__cxx11::string::string((string *)&local_108,&__str->first);
      pvVar10 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&ret,&local_108);
      vVar12 = (pvVar10->m_data).m_type;
      (pvVar10->m_data).m_type = local_1e8.m_type;
      jVar1 = (pvVar10->m_data).m_value;
      (pvVar10->m_data).m_value = local_1e8.m_value;
      local_1e8.m_type = vVar12;
      local_1e8.m_value = jVar1;
      std::__cxx11::string::~string((string *)&local_108);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1e8);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1a0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&ret);
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"tags");
    vVar12 = (pvVar10->m_data).m_type;
    (pvVar10->m_data).m_type = local_1a0.m_type;
    jVar1 = (pvVar10->m_data).m_value;
    (pvVar10->m_data).m_value = local_1a0.m_value;
    local_1a0.m_type = vVar12;
    local_1a0.m_value = jVar1;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_1a0);
    this_01 = &ret;
    goto LAB_0024e54b;
  }
  ActionMessage::~ActionMessage(&queryReq);
  return;
}

Assistant:

void CommonCore::initializeMapBuilder(std::string_view request,
                                      std::uint16_t index,
                                      QueryReuse reuse,
                                      bool force_ordering) const
{
    if (!isValidIndex(index, mapBuilders)) {
        mapBuilders.resize(static_cast<size_t>(index) + 1);
    }
    std::get<2>(mapBuilders[index]) = reuse;
    auto& builder = std::get<0>(mapBuilders[index]);
    builder.reset();
    nlohmann::json& base = builder.getJValue();
    addBaseInformation(base, true);
    ActionMessage queryReq(force_ordering ? CMD_QUERY_ORDERED : CMD_QUERY);
    if (index == GLOBAL_FLUSH) {
        queryReq.setAction(CMD_QUERY_ORDERED);
    }
    queryReq.payload = request;
    queryReq.source_id = global_broker_id_local;
    queryReq.counter = index;  // indicating which processing to use
    if (loopFederates.size() > 0 || filterFed != nullptr || translatorFed != nullptr) {
        base["federates"] = nlohmann::json::array();
        for (const auto& fed : loopFederates) {
            const int brkindex =
                builder.generatePlaceHolder("federates", fed->global_id.load().baseValue());
            const std::string ret = federateQuery(fed.fed, request, force_ordering);
            if (ret == "#wait") {
                if (fed->getState() <= FederateStates::EXECUTING) {
                    queryReq.messageID = brkindex;
                    queryReq.dest_id = fed.fed->global_id;
                    fed.fed->addAction(queryReq);
                } else {
                    // the federate has terminated or errored so is waiting, global_state doesn't
                    // block
                    builder.addComponent(federateQuery(fed.fed, "global_state", force_ordering),
                                         brkindex);
                }
            } else {
                builder.addComponent(ret, brkindex);
            }
        }
        if (filterFed != nullptr) {
            const int brkindex =
                builder.generatePlaceHolder("federates", filterFedID.load().baseValue());
            const std::string ret = filterFed->query(request);
            builder.addComponent(ret, brkindex);
        }
        if (translatorFed != nullptr) {
            const int brkindex =
                builder.generatePlaceHolder("federates", translatorFedID.load().baseValue());
            const std::string ret = translatorFed->query(request);
            builder.addComponent(ret, brkindex);
        }
    }

    switch (index) {
        case CURRENT_TIME_MAP:
        case GLOBAL_STATUS:
            if (hasTimeDependency) {
                base["next_time"] = static_cast<double>(timeCoord->getNextTime());
            }
            break;
        case DEPENDENCY_GRAPH: {
            if (hasTimeDependency) {
                base["dependents"] = nlohmann::json::array();
                for (const auto& dep : timeCoord->getDependents()) {
                    base["dependents"].push_back(dep.baseValue());
                }
                base["dependencies"] = nlohmann::json::array();
                for (const auto& dep : timeCoord->getDependencies()) {
                    base["dependencies"].push_back(dep.baseValue());
                }
            }
        } break;
        case GLOBAL_STATE:
            base["state"] = brokerStateName(getBrokerState());
            break;
        case GLOBAL_TIME_DEBUGGING:
            base["state"] = brokerStateName(getBrokerState());
            if (timeCoord && !timeCoord->empty()) {
                base["time"] = nlohmann::json();
                timeCoord->generateDebuggingTimeInfo(base["time"]);
            }
            break;
        case UNCONNECTED_INTERFACES:
            if (!tags.empty()) {
                nlohmann::json tagBlock = nlohmann::json::object();
                for (const auto& tag : tags) {
                    tagBlock[tag.first] = tag.second;
                }
                base["tags"] = tagBlock;
            }
            break;
        default:
            break;
    }
}